

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_xattrs(archive_write_disk *a)

{
  archive_entry *a_00;
  int iVar1;
  char *__path;
  int *piVar2;
  uint *puVar3;
  archive_entry *in_RDI;
  wchar_t e;
  size_t size;
  void *value;
  char *name;
  wchar_t i;
  wchar_t ret;
  archive_entry *entry;
  archive_entry *in_stack_ffffffffffffffb8;
  int local_34;
  size_t local_30;
  void *local_28;
  char *local_20;
  wchar_t local_18;
  wchar_t local_14;
  archive_entry *local_10;
  archive_entry *local_8;
  
  local_10 = (archive_entry *)(in_RDI->ae_gname).aes_mbs_in_locale.length;
  local_14 = L'\0';
  local_8 = in_RDI;
  local_18 = archive_entry_xattr_reset((archive_entry *)0x17ba0c);
  while (local_18 != L'\0') {
    local_18 = local_18 + L'\xffffffff';
    archive_entry_xattr_next(local_10,&local_20,&local_28,&local_30);
    if (((local_20 == (char *)0x0) || (iVar1 = strncmp(local_20,"xfsroot.",8), iVar1 == 0)) ||
       (iVar1 = strncmp(local_20,"system.",7), iVar1 == 0)) {
      archive_set_error((archive *)local_8,0x54,"Invalid extended attribute encountered");
      local_14 = L'\xffffffec';
    }
    else {
      if (*(int *)((long)&(local_8->ae_hardlink).aes_utf8.s + 4) < 0) {
        __path = archive_entry_pathname(in_stack_ffffffffffffffb8);
        local_34 = lsetxattr(__path,local_20,local_28,local_30,0);
      }
      else {
        local_34 = fsetxattr(*(int *)((long)&(local_8->ae_hardlink).aes_utf8.s + 4),local_20,
                             local_28,local_30,0);
      }
      if (local_34 == -1) {
        piVar2 = __errno_location();
        if ((*piVar2 == 0x5f) || (piVar2 = __errno_location(), *piVar2 == 0x26)) {
          a_00 = local_8;
          if (set_xattrs::warning_done == L'\0') {
            set_xattrs::warning_done = L'\x01';
            puVar3 = (uint *)__errno_location();
            archive_set_error((archive *)a_00,(int)(ulong)*puVar3,
                              "Cannot restore extended attributes on this file system");
          }
        }
        else {
          in_stack_ffffffffffffffb8 = local_8;
          puVar3 = (uint *)__errno_location();
          archive_set_error((archive *)in_stack_ffffffffffffffb8,(int)(ulong)*puVar3,
                            "Failed to set extended attribute");
        }
        local_14 = L'\xffffffec';
      }
    }
  }
  return local_14;
}

Assistant:

static int
set_xattrs(struct archive_write_disk *a)
{
	struct archive_entry *entry = a->entry;
	static int warning_done = 0;
	int ret = ARCHIVE_OK;
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		size_t size;
		archive_entry_xattr_next(entry, &name, &value, &size);
		if (name != NULL &&
				strncmp(name, "xfsroot.", 8) != 0 &&
				strncmp(name, "system.", 7) != 0) {
			int e;
#if HAVE_FSETXATTR
			if (a->fd >= 0)
				e = fsetxattr(a->fd, name, value, size, 0);
			else
#elif HAVE_FSETEA
			if (a->fd >= 0)
				e = fsetea(a->fd, name, value, size, 0);
			else
#endif
			{
#if HAVE_LSETXATTR
				e = lsetxattr(archive_entry_pathname(entry),
				    name, value, size, 0);
#elif HAVE_LSETEA
				e = lsetea(archive_entry_pathname(entry),
				    name, value, size, 0);
#endif
			}
			if (e == -1) {
				if (errno == ENOTSUP || errno == ENOSYS) {
					if (!warning_done) {
						warning_done = 1;
						archive_set_error(&a->archive, errno,
						    "Cannot restore extended "
						    "attributes on this file "
						    "system");
					}
				} else
					archive_set_error(&a->archive, errno,
					    "Failed to set extended attribute");
				ret = ARCHIVE_WARN;
			}
		} else {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid extended attribute encountered");
			ret = ARCHIVE_WARN;
		}
	}
	return (ret);
}